

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# positional_reference_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::PositionalReferenceExpression::Copy(PositionalReferenceExpression *this)

{
  pointer this_00;
  ParsedExpression *in_RSI;
  _func_int **local_20;
  
  make_uniq<duckdb::PositionalReferenceExpression,unsigned_long_const&>
            ((duckdb *)&local_20,(unsigned_long *)(in_RSI + 1));
  this_00 = unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
            ::operator->((unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
                          *)&local_20);
  ParsedExpression::CopyProperties(&this_00->super_ParsedExpression,in_RSI);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression = local_20;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> PositionalReferenceExpression::Copy() const {
	auto copy = make_uniq<PositionalReferenceExpression>(index);
	copy->CopyProperties(*this);
	return std::move(copy);
}